

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  int *piVar1;
  uint *puVar2;
  bool bVar3;
  int result_1;
  uint uVar4;
  long lVar5;
  TestCase *pTVar6;
  uint uVar7;
  int result;
  int iVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  timeval t;
  Approx AStack_48;
  Approx local_30;
  
  iVar8 = 0;
  gettimeofday((timeval *)&local_30,(__timezone_ptr_t)0x0);
  lVar5 = ((long)local_30.m_epsilon * 1000000 + (long)local_30.m_scale) - (this->timer).m_ticks;
  auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar11._0_8_ = lVar5;
  auVar11._12_4_ = 0x45300000;
  (this->super_CurrentTestCaseStats).seconds =
       ((auVar11._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / 1000000.0;
  lVar5 = 0;
  do {
    iVar8 = iVar8 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar5 + -4)
    ;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x800);
  piVar1 = &(this->super_TestRunStats).numAsserts;
  *piVar1 = *piVar1 + iVar8;
  iVar8 = 0;
  lVar5 = 0;
  do {
    iVar8 = iVar8 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                            lVar5 + -4);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x800);
  piVar1 = &(this->super_TestRunStats).numAssertsFailed;
  *piVar1 = *piVar1 + iVar8;
  iVar8 = 0;
  lVar5 = 0;
  do {
    iVar8 = iVar8 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar5 + -4)
    ;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsCurrentTest = iVar8;
  iVar8 = 0;
  lVar5 = 0;
  do {
    iVar8 = iVar8 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                            lVar5 + -4);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = iVar8;
  if (iVar8 != 0) {
    piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  Approx::Approx(&local_30,
                 (((this->super_ContextOptions).currentTest)->super_TestCaseData).m_timeout);
  local_30.m_epsilon = 2.220446049250313e-16;
  dVar9 = ABS(local_30.m_value);
  if (dVar9 <= 0.0) {
    dVar9 = 0.0;
  }
  if (ABS(0.0 - local_30.m_value) < (dVar9 + local_30.m_scale) * 2.220446049250313e-16) {
    pTVar6 = (this->super_ContextOptions).currentTest;
  }
  else {
    Approx::Approx(&AStack_48,(this->super_CurrentTestCaseStats).seconds);
    pTVar6 = (this->super_ContextOptions).currentTest;
    dVar9 = (pTVar6->super_TestCaseData).m_timeout;
    if (dVar9 < AStack_48.m_value) {
      dVar10 = ABS(AStack_48.m_value);
      if (ABS(AStack_48.m_value) <= ABS(dVar9)) {
        dVar10 = ABS(dVar9);
      }
      if ((dVar10 + AStack_48.m_scale) * 2.220446049250313e-16 <= ABS(dVar9 - AStack_48.m_value)) {
        piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
        *(byte *)piVar1 = (byte)*piVar1 | 0x10;
      }
    }
  }
  uVar4 = (this->super_CurrentTestCaseStats).failure_flags;
  if ((pTVar6->super_TestCaseData).m_should_fail == true) {
    uVar7 = 0x40;
    if (uVar4 == 0) {
      (this->super_CurrentTestCaseStats).failure_flags = 0x20;
      uVar4 = 0x20;
      goto LAB_0012042e;
    }
LAB_00120416:
    uVar4 = uVar4 | uVar7;
    (this->super_CurrentTestCaseStats).failure_flags = uVar4;
  }
  else {
    if ((uVar4 != 0) && (uVar7 = 0x200, (pTVar6->super_TestCaseData).m_may_fail != false))
    goto LAB_00120416;
    iVar8 = (pTVar6->super_TestCaseData).m_expected_failures;
    if (0 < iVar8) {
      uVar7 = (uint)((this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest == iVar8) * 0x80
              + 0x80;
      goto LAB_00120416;
    }
  }
  if ((uVar4 & 0x240) != 0) {
    (this->super_CurrentTestCaseStats).testCaseSuccess = true;
    return;
  }
LAB_0012042e:
  bVar3 = (bool)(uVar4 == 0 | (byte)(uVar4 >> 8) & 1);
  (this->super_CurrentTestCaseStats).testCaseSuccess = bVar3;
  if (bVar3 == false) {
    puVar2 = &(this->super_TestRunStats).numTestCasesFailed;
    *puVar2 = *puVar2 + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            testCaseSuccess = !(failure_flags && !ok_to_fail);
            if(!testCaseSuccess)
                numTestCasesFailed++;
        }